

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O0

int X509_check_private_key(X509 *x509,EVP_PKEY *pkey)

{
  int iVar1;
  EVP_PKEY *a;
  int ret;
  EVP_PKEY *xk;
  EVP_PKEY *k_local;
  X509 *x_local;
  
  a = (EVP_PKEY *)X509_get0_pubkey((X509 *)x509);
  if (a == (EVP_PKEY *)0x0) {
    x_local._4_4_ = 0;
  }
  else {
    iVar1 = EVP_PKEY_cmp(a,pkey);
    if (iVar1 < 1) {
      if (iVar1 == -2) {
        ERR_put_error(0xb,0,0x80,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_cmp.cc"
                      ,0xdb);
        x_local._4_4_ = 0;
      }
      else if (iVar1 == -1) {
        ERR_put_error(0xb,0,0x73,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_cmp.cc"
                      ,0xd8);
        x_local._4_4_ = 0;
      }
      else if (iVar1 == 0) {
        ERR_put_error(0xb,0,0x74,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_cmp.cc"
                      ,0xd5);
        x_local._4_4_ = 0;
      }
      else {
        x_local._4_4_ = 0;
      }
    }
    else {
      x_local._4_4_ = 1;
    }
  }
  return x_local._4_4_;
}

Assistant:

int X509_check_private_key(const X509 *x, const EVP_PKEY *k) {
  const EVP_PKEY *xk = X509_get0_pubkey(x);
  if (xk == NULL) {
    return 0;
  }

  int ret = EVP_PKEY_cmp(xk, k);
  if (ret > 0) {
    return 1;
  }

  switch (ret) {
    case 0:
      OPENSSL_PUT_ERROR(X509, X509_R_KEY_VALUES_MISMATCH);
      return 0;
    case -1:
      OPENSSL_PUT_ERROR(X509, X509_R_KEY_TYPE_MISMATCH);
      return 0;
    case -2:
      OPENSSL_PUT_ERROR(X509, X509_R_UNKNOWN_KEY_TYPE);
      return 0;
  }

  return 0;
}